

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation_Management_Header.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Simulation_Management_Header::Simulation_Management_Header
          (Simulation_Management_Header *this,EntityIdentifier *OriginatingEntityID,
          EntityIdentifier *ReceivingEntityID)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Simulation_Management_Header_00222760;
  (this->m_OriginatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar1 = (OriginatingEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_OriginatingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (OriginatingEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_OriginatingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_OriginatingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_OriginatingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(OriginatingEntityID->super_SimulationIdentifier).field_0xc;
  (this->m_ReceivingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar1 = (ReceivingEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ReceivingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (ReceivingEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ReceivingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ReceivingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223c00;
  *(undefined2 *)&(this->m_ReceivingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ReceivingEntityID->super_SimulationIdentifier).field_0xc;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x05';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Simulation_Management_Header::Simulation_Management_Header( const EntityIdentifier & OriginatingEntityID, const EntityIdentifier & ReceivingEntityID ) :
    m_OriginatingEntityID( OriginatingEntityID ),
    m_ReceivingEntityID( ReceivingEntityID )
{
    m_ui8ProtocolFamily = Simulation_Management;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}